

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::lookupGeometries
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  undefined8 *puVar2;
  void *pvVar3;
  GroupNode *this_00;
  mapped_type *pmVar4;
  Node *pNVar5;
  key_type *in_RDX;
  Node *pNVar6;
  bool bVar7;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  geometries;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  local_78;
  Transformations local_58;
  
  pNVar6 = node[3].ptr;
  pNVar1 = (Node *)(node + 2);
  pNVar5 = pNVar1;
  if (pNVar6 != (Node *)0x0) {
    do {
      bVar7 = (Node *)(pNVar6->fileName).field_2._M_allocated_capacity < in_RDX->ptr;
      if (!bVar7) {
        pNVar5 = pNVar6;
      }
      pNVar6 = (Node *)(&(pNVar6->fileName)._M_dataplus)[bVar7]._M_p;
    } while (pNVar6 != (Node *)0x0);
  }
  pNVar6 = pNVar1;
  if ((pNVar5 != pNVar1) &&
     (pNVar6 = pNVar5, in_RDX->ptr < (Node *)(pNVar5->fileName).field_2._M_allocated_capacity)) {
    pNVar6 = pNVar1;
  }
  if (pNVar6 == pNVar1) {
    local_78.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.time_range.lower = 0.0;
    local_58.time_range.upper = 1.0;
    local_58.spaces.size_active = 0;
    local_58.spaces.size_alloced._0_1_ = 0;
    local_58.spaces.size_alloced._1_7_ = 0;
    local_58.spaces.items._0_1_ = 0;
    local_58.spaces.items._1_7_ = 0;
    local_58.quaternion = false;
    pvVar3 = alignedMalloc(0x40,0x10);
    local_58.spaces.items._0_1_ = SUB81(pvVar3,0);
    local_58.spaces.items._1_7_ = (undefined7)((ulong)pvVar3 >> 8);
    alignedFree((void *)0x0);
    local_58.spaces.size_alloced._0_1_ = 1;
    local_58.spaces.size_alloced._1_7_ = 0;
    puVar2 = (undefined8 *)CONCAT71(local_58.spaces.items._1_7_,local_58.spaces.items._0_1_);
    local_58.spaces.size_active = 1;
    *puVar2 = 0x3f800000;
    puVar2[1] = 0;
    puVar2[2] = 0x3f80000000000000;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[5] = 0x3f800000;
    puVar2[6] = 0;
    puVar2[7] = 0x3f80000000000000;
    convertGeometries((SceneGraphFlattener *)node,&local_78,in_RDX,&local_58);
    alignedFree((void *)CONCAT71(local_58.spaces.items._1_7_,local_58.spaces.items._0_1_));
    this_00 = (GroupNode *)operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_00,&local_78);
    pmVar4 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)(node + 1),in_RDX);
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
    if (pmVar4->ptr != (Node *)0x0) {
      (*(pmVar4->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar4->ptr = (Node *)this_00;
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::~vector(&local_78);
  }
  pmVar4 = std::
           map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
           ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         *)(node + 1),in_RDX);
  pNVar1 = pmVar4->ptr;
  (this->node).ptr = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> lookupGeometries(Ref<SceneGraph::Node> node)
    {
      if (object_mapping.find(node) == object_mapping.end())
      {
        std::vector<Ref<SceneGraph::Node>> geometries;
        convertGeometries(geometries,node,one);
        object_mapping[node] = new SceneGraph::GroupNode(geometries);
      }
      
      return object_mapping[node];
    }